

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  int j_1;
  int i_8;
  float *ptr_9;
  int q_4;
  int j;
  float *ptr_8;
  int i_7;
  int q_3;
  int i_6;
  float *ptr_7;
  int q_2;
  float *ptr_6;
  int i_5;
  int size_1;
  int i_4;
  float *ptr_5;
  int q_1;
  int i_3;
  float *ptr_4;
  int q;
  float *ptr_3;
  int i_2;
  int size;
  float *ptr_2;
  int i_1;
  float *ptr_1;
  int i;
  float *ptr;
  int positive_axis;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 *in_stack_fffffffffffff7f8;
  float *in_stack_fffffffffffff800;
  int local_74c;
  int local_740;
  int local_73c;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  undefined4 local_720;
  long local_718;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 local_700;
  undefined8 local_6f8;
  long local_6f0;
  int local_6e8;
  int local_6e4;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  long local_6c0;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined8 local_6a0;
  float local_698 [8];
  long local_678;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined8 local_658;
  long local_650;
  int local_644;
  int local_640;
  int local_63c;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined4 local_620;
  long local_618;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined8 local_5f8;
  long local_5f0;
  int local_5e4;
  long local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  long local_5a8;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  undefined8 local_588;
  long local_580;
  int local_574;
  int local_570;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined4 local_548;
  long local_540;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined8 local_520;
  long local_518;
  int local_50c;
  long local_508;
  int local_500;
  int local_4fc;
  long local_4f8;
  int local_4ec;
  long local_4e8;
  int local_4dc;
  long local_4d8;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b0;
  undefined8 *local_4a0;
  float *local_498;
  undefined8 *local_490;
  long *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  long *local_470;
  long *local_468;
  int local_454;
  long *local_450;
  undefined1 local_445;
  int local_444;
  undefined8 *local_438;
  undefined1 local_42d;
  int local_42c;
  undefined8 *local_420;
  undefined1 local_415;
  int local_414;
  undefined8 *local_408;
  undefined1 local_3fd;
  int local_3fc;
  undefined8 *local_3f0;
  undefined1 local_3e5;
  int local_3e4;
  undefined8 *local_3d8;
  undefined8 *local_3a8;
  undefined8 *local_398;
  undefined8 *local_388;
  float *local_378;
  undefined8 *local_368;
  undefined8 *local_358;
  int local_344;
  undefined8 *local_340;
  float *local_338;
  long local_330;
  undefined4 local_324;
  long local_320;
  long local_318;
  undefined4 local_30c;
  int local_308;
  int local_304;
  undefined8 *local_300;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  long local_2a8;
  undefined4 local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  long local_288;
  undefined4 local_27c;
  long local_278;
  long local_270;
  undefined4 local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  long local_250;
  undefined4 local_244;
  long local_240;
  long local_238;
  undefined4 local_22c;
  int local_228;
  int local_224;
  undefined8 *local_220;
  undefined4 local_214;
  long local_210;
  undefined4 local_204;
  long local_200;
  undefined4 local_1f4;
  long local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  undefined8 *local_1b0;
  undefined8 *local_190;
  float *local_170;
  undefined8 *local_150;
  undefined8 *local_130;
  undefined8 *local_110;
  long local_30;
  undefined4 local_24;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  float *local_8;
  
  local_4bc = (int)in_RSI[5];
  local_4c0 = *(int *)((long)in_RSI + 0x2c);
  local_4c4 = (int)in_RSI[6];
  local_4c8 = *(int *)((long)in_RSI + 0x34);
  local_4cc = (int)in_RSI[7];
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_74c = local_4bc + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_74c = *(int *)(in_RDI + 0xd0);
  }
  local_4d0 = local_74c;
  local_4b0 = in_RSI;
  if (local_4bc == 1) {
    local_4d8 = *in_RSI;
    softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  }
  if ((local_4bc == 2) && (local_4d0 == 0)) {
    for (local_4dc = 0; local_4dc < local_4c0; local_4dc = local_4dc + 1) {
      local_468 = local_4b0;
      local_4e8 = *local_4b0 + (long)local_4dc * 4;
      softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
              (int)in_stack_fffffffffffff7f8);
    }
  }
  if ((local_4bc == 2) && (local_4d0 == 1)) {
    for (local_4ec = 0; local_4ec < local_4c4; local_4ec = local_4ec + 1) {
      local_450 = local_4b0;
      local_454 = local_4ec;
      local_4f8 = *local_4b0 +
                  (long)*(int *)((long)local_4b0 + 0x2c) * (long)local_4ec * local_4b0[2];
      softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
    }
  }
  if ((local_4bc == 3) && (local_4d0 == 0)) {
    local_4fc = local_4c0 * local_4c4;
    for (local_500 = 0; local_500 < local_4fc; local_500 = local_500 + 1) {
      local_470 = local_4b0;
      local_508 = *local_4b0 + (long)local_500 * 4;
      softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
              (int)in_stack_fffffffffffff7f8);
    }
  }
  if ((local_4bc == 3) && (local_4d0 == 1)) {
    for (local_50c = 0; local_50c < local_4cc; local_50c = local_50c + 1) {
      local_3d8 = &local_560;
      local_304 = *(int *)((long)local_4b0 + 0x2c);
      local_308 = (int)local_4b0[6];
      local_30c = *(undefined4 *)((long)local_4b0 + 0x34);
      local_518 = *local_4b0 + local_4b0[8] * (long)local_50c * local_4b0[2];
      local_320 = local_4b0[2];
      local_324 = (undefined4)local_4b0[3];
      local_330 = local_4b0[4];
      local_300 = &local_560;
      local_1d0 = (long)local_304 * (long)local_308 * local_320;
      local_478 = &local_560;
      local_3a8 = &local_560;
      local_1d4 = 0x10;
      local_3e4 = local_50c;
      local_3e5 = 1;
      local_560 = 0;
      local_550 = 0;
      local_548 = 0;
      local_538 = 0;
      local_534 = 0;
      local_530 = 0;
      local_52c = 0;
      local_528 = 0;
      local_520 = 0;
      local_558 = 0;
      local_318 = local_518;
      local_110 = local_3a8;
      local_540 = local_330;
      for (local_570 = 0; local_570 < local_4c0; local_570 = local_570 + 1) {
        softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                (int)in_stack_fffffffffffff7f8);
        local_518 = local_518 + 4;
      }
    }
  }
  if ((local_4bc == 3) && (local_4d0 == 2)) {
    for (local_574 = 0; local_574 < local_4cc; local_574 = local_574 + 1) {
      local_3f0 = &local_5c8;
      local_2cc = *(int *)((long)local_4b0 + 0x2c);
      local_2d0 = (int)local_4b0[6];
      local_2d4 = *(undefined4 *)((long)local_4b0 + 0x34);
      local_580 = *local_4b0 + local_4b0[8] * (long)local_574 * local_4b0[2];
      local_2e8 = local_4b0[2];
      local_2ec = (undefined4)local_4b0[3];
      local_2f8 = local_4b0[4];
      local_2c8 = &local_5c8;
      local_1e0 = (long)local_2cc * (long)local_2d0 * local_2e8;
      local_480 = &local_5c8;
      local_398 = &local_5c8;
      local_1e4 = 0x10;
      local_3fc = local_574;
      local_3fd = 1;
      local_5c8 = 0;
      local_5b8 = 0;
      local_5b0 = 0;
      local_5a0 = 0;
      local_59c = 0;
      local_598 = 0;
      local_594 = 0;
      local_590 = 0;
      local_588 = 0;
      local_5c0 = 0;
      local_2e0 = local_580;
      local_130 = local_398;
      local_5a8 = local_2f8;
      for (local_5cc = 0; local_5cc < local_4c4; local_5cc = local_5cc + 1) {
        softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
        local_580 = local_580 + (long)local_4c0 * 4;
      }
    }
  }
  if ((local_4bc == 4) && (local_4d0 == 0)) {
    local_5d0 = local_4c0 * local_4c4 * local_4c8;
    for (local_5d4 = 0; local_5d4 < local_5d0; local_5d4 = local_5d4 + 1) {
      local_488 = local_4b0;
      local_5e0 = *local_4b0 + (long)local_5d4 * 4;
      softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
              (int)in_stack_fffffffffffff7f8);
    }
  }
  if ((local_4bc == 4) && (local_4d0 == 1)) {
    for (local_5e4 = 0; local_5e4 < local_4cc; local_5e4 = local_5e4 + 1) {
      local_408 = &local_638;
      local_294 = *(int *)((long)local_4b0 + 0x2c);
      local_298 = (int)local_4b0[6];
      local_29c = *(undefined4 *)((long)local_4b0 + 0x34);
      local_5f0 = *local_4b0 + local_4b0[8] * (long)local_5e4 * local_4b0[2];
      local_2b0 = local_4b0[2];
      local_2b4 = (undefined4)local_4b0[3];
      local_2c0 = local_4b0[4];
      local_290 = &local_638;
      local_1f0 = (long)local_294 * (long)local_298 * local_2b0;
      local_490 = &local_638;
      local_388 = &local_638;
      local_1f4 = 0x10;
      local_414 = local_5e4;
      local_415 = 1;
      local_638 = 0;
      local_628 = 0;
      local_620 = 0;
      local_610 = 0;
      local_60c = 0;
      local_608 = 0;
      local_604 = 0;
      local_600 = 0;
      local_5f8 = 0;
      local_630 = 0;
      local_2a8 = local_5f0;
      local_150 = local_388;
      local_618 = local_2c0;
      for (local_63c = 0; local_63c < local_4c0 * local_4c4; local_63c = local_63c + 1) {
        softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                (int)in_stack_fffffffffffff7f8);
        local_5f0 = local_5f0 + 4;
      }
    }
  }
  if ((local_4bc == 4) && (local_4d0 == 2)) {
    for (local_640 = 0; local_640 < local_4cc; local_640 = local_640 + 1) {
      for (local_644 = 0; local_644 < local_4c8; local_644 = local_644 + 1) {
        local_420 = &local_6e0;
        local_25c = *(int *)((long)local_4b0 + 0x2c);
        local_260 = (int)local_4b0[6];
        local_264 = *(undefined4 *)((long)local_4b0 + 0x34);
        local_270 = *local_4b0 + local_4b0[8] * (long)local_640 * local_4b0[2];
        local_278 = local_4b0[2];
        local_27c = (undefined4)local_4b0[3];
        local_288 = local_4b0[4];
        local_258 = &local_6e0;
        local_200 = (long)local_25c * (long)local_260 * local_278;
        local_338 = local_698;
        local_340 = &local_6e0;
        local_650 = local_270 + (long)local_25c * (long)local_260 * (long)local_644 * local_278;
        local_8 = local_698;
        local_498 = local_698;
        in_stack_fffffffffffff800 = local_698;
        in_stack_fffffffffffff7f8 = &local_6e0;
        local_658 = 0;
        local_660 = 0;
        local_664 = 0;
        local_668 = 0;
        local_66c = 0;
        local_670 = 0;
        local_698[6] = 0.0;
        local_698[4] = 0.0;
        local_698[5] = 0.0;
        local_698[2] = 0.0;
        local_698[3] = 0.0;
        local_698[0] = 0.0;
        local_698[1] = 0.0;
        local_204 = 0x10;
        local_344 = local_644;
        local_42c = local_640;
        local_42d = 1;
        local_6e0 = 0;
        local_6d0 = 0;
        local_6c8 = 0;
        local_6b8 = 0;
        local_6b4 = 0;
        local_6b0 = 0;
        local_6ac = 0;
        local_6a8 = 0;
        local_6a0 = 0;
        local_6d8 = 0;
        local_378 = in_stack_fffffffffffff800;
        local_368 = in_stack_fffffffffffff7f8;
        local_190 = in_stack_fffffffffffff7f8;
        local_170 = in_stack_fffffffffffff800;
        local_30 = local_288;
        local_24 = local_27c;
        local_20 = local_278;
        local_18 = local_650;
        local_10 = local_260;
        local_c = local_25c;
        local_6c0 = local_288;
        local_678 = local_288;
        for (local_6e4 = 0; local_6e4 < local_4c0; local_6e4 = local_6e4 + 1) {
          softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                  (int)in_stack_fffffffffffff7f8);
          local_650 = local_650 + 4;
        }
      }
    }
  }
  if ((local_4bc == 4) && (local_4d0 == 3)) {
    for (local_6e8 = 0; local_6e8 < local_4cc; local_6e8 = local_6e8 + 1) {
      local_438 = &local_738;
      local_224 = *(int *)((long)local_4b0 + 0x2c);
      local_228 = (int)local_4b0[6];
      local_22c = *(undefined4 *)((long)local_4b0 + 0x34);
      local_6f0 = *local_4b0 + local_4b0[8] * (long)local_6e8 * local_4b0[2];
      local_240 = local_4b0[2];
      local_244 = (undefined4)local_4b0[3];
      local_250 = local_4b0[4];
      local_220 = &local_738;
      local_210 = (long)local_224 * (long)local_228 * local_240;
      local_4a0 = &local_738;
      local_358 = &local_738;
      local_214 = 0x10;
      local_444 = local_6e8;
      local_445 = 1;
      local_738 = 0;
      local_728 = 0;
      local_720 = 0;
      local_710 = 0;
      local_70c = 0;
      local_708 = 0;
      local_704 = 0;
      local_700 = 0;
      local_6f8 = 0;
      local_730 = 0;
      local_238 = local_6f0;
      local_1b0 = local_358;
      local_718 = local_250;
      for (local_73c = 0; local_73c < local_4c8; local_73c = local_73c + 1) {
        for (local_740 = 0; local_740 < local_4c4; local_740 = local_740 + 1) {
          softmax(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
          local_6f0 = local_6f0 + (long)local_4c0 * 4;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        softmax(ptr, w);
    }

    if (dims == 2 && positive_axis == 0)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, h, w);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w);
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        const int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                softmax(ptr, h, w);
                ptr += 1;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w);
                ptr += w;
            }
        }
    }

    if (dims == 4 && positive_axis == 0)
    {
        const int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w * h; i++)
            {
                softmax(ptr, d, w * h);
                ptr += 1;
            }
        }
    }

    if (dims == 4 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                for (int j = 0; j < w; j++)
                {
                    softmax(ptr, h, w);
                    ptr += 1;
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w);
                    ptr += w;
                }
            }
        }
    }

    return 0;
}